

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

TCPConnection * __thiscall
ProtocolTCP::LocateConnection
          (ProtocolTCP *this,uint16_t remotePort,uint8_t *remoteAddress,uint16_t localPort)

{
  bool bVar1;
  size_t sVar2;
  int local_30;
  int i;
  uint16_t localPort_local;
  uint8_t *remoteAddress_local;
  uint16_t remotePort_local;
  ProtocolTCP *this_local;
  
  for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
    if ((*(uint16_t *)(&this->field_0x4 + (long)local_30 * 0x370) == localPort) &&
       (*(uint16_t *)(&this->field_0x6 + (long)local_30 * 0x370) == remotePort)) {
      sVar2 = ProtocolIPv4::AddressSize(this->IP);
      bVar1 = AddressCompare(&this->field_0x8 + (long)local_30 * 0x370,remoteAddress,(int)sVar2);
      if (bVar1) {
        return (TCPConnection *)(&this->field_0x0 + (long)local_30 * 0x370);
      }
    }
  }
  local_30 = 0;
  while( true ) {
    if (4 < local_30) {
      return (TCPConnection *)0x0;
    }
    if ((*(uint16_t *)(&this->field_0x4 + (long)local_30 * 0x370) == localPort) &&
       (*(int *)(&this->field_0x0 + (long)local_30 * 0x370) == 1)) break;
    local_30 = local_30 + 1;
  }
  return (TCPConnection *)(&this->field_0x0 + (long)local_30 * 0x370);
}

Assistant:

TCPConnection* ProtocolTCP::LocateConnection(uint16_t remotePort,
                                             const uint8_t* remoteAddress,
                                             uint16_t localPort)
{
    int i;

    // Must do two passes:
    // First pass to look for established connections
    // Second pass to look for listening connections

    // Pass 1
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        // printf("%s %d: connection port %d, state %s\n",
        //        FindFileName(__FILE__),
        //        __LINE__,
        //        ConnectionList[i].LocalPort,
        //        ConnectionList[i].GetStateString());
        if (ConnectionList[i].LocalPort == localPort &&
            ConnectionList[i].RemotePort == remotePort &&
            AddressCompare(ConnectionList[i].RemoteAddress, remoteAddress, IP.AddressSize()))
        {
            return &ConnectionList[i];
        }
    }

    // Pass 2
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == localPort &&
            ConnectionList[i].State == TCPConnection::LISTEN)
        {
            return &ConnectionList[i];
        }
    }

    return nullptr;
}